

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O0

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_63<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_63<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
         *this)

{
  long *plVar1;
  long in_RDI;
  CATCH2_INTERNAL_TEMPLATE_TEST_63<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>
  obj;
  code *local_88;
  long local_58 [11];
  
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_63<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>::
  CATCH2_INTERNAL_TEMPLATE_TEST_63
            ((CATCH2_INTERNAL_TEMPLATE_TEST_63<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>
              *)0x8c84b6);
  local_88 = *(code **)(in_RDI + 8);
  plVar1 = (long *)((long)local_58 + *(long *)(in_RDI + 0x10));
  if (((ulong)local_88 & 1) != 0) {
    local_88 = *(code **)(local_88 + *plVar1 + -1);
  }
  (*local_88)(plVar1);
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_63<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>::
  ~CATCH2_INTERNAL_TEMPLATE_TEST_63
            ((CATCH2_INTERNAL_TEMPLATE_TEST_63<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>
              *)0x8c851a);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }